

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_14fe923::processObjectKindVersions
          (string *__return_storage_ptr__,anon_unknown_dwarf_14fe923 *this,cmFileAPI *fileApi,
          ObjectKind objectKind,string_view keyword,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *versions)

{
  bool bVar1;
  uint majorVersion_00;
  reference b;
  char *__nptr;
  long lVar2;
  undefined4 in_register_0000000c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type pos;
  int minorVersion;
  int majorVersion;
  char *vStart;
  string *ver;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *versions_local;
  ObjectKind objectKind_local;
  cmFileAPI *fileApi_local;
  string_view keyword_local;
  
  fileApi_local = (cmFileAPI *)CONCAT44(in_register_0000000c,objectKind);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)keyword._M_str;
  keyword_local._M_len = keyword._M_len;
  keyword_local._M_str = (char *)__return_storage_ptr__;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_00);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    ver = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&ver), bVar1) {
      b = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
      __nptr = (char *)std::__cxx11::string::c_str();
      majorVersion_00 = atoi(__nptr);
      pos._0_4_ = 0;
      lVar2 = std::__cxx11::string::find((char)b,0x2e);
      if (lVar2 != -1) {
        pos._0_4_ = atoi(__nptr + lVar2 + 1);
      }
      if (((int)majorVersion_00 < 1) || ((int)(uint)pos < 0)) {
        cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[7],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[2]>
                  (__return_storage_ptr__,(char (*) [28])"Given a malformed version \"",b,
                   (char (*) [7])"\" for ",
                   (basic_string_view<char,_std::char_traits<char>_> *)&fileApi_local,
                   (char (*) [2])0x1116d31);
        return __return_storage_ptr__;
      }
      bVar1 = cmFileAPI::AddProjectQuery
                        ((cmFileAPI *)this,(ObjectKind)fileApi,majorVersion_00,(uint)pos);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    cmStrCat<char_const(&)[23],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[49]>
              (__return_storage_ptr__,(char (*) [23])"None of the specified ",
               (basic_string_view<char,_std::char_traits<char>_> *)&fileApi_local,
               (char (*) [49])" versions is supported by this version of CMake.");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string processObjectKindVersions(cmFileAPI& fileApi,
                                      cmFileAPI::ObjectKind objectKind,
                                      cm::string_view keyword,
                                      const std::vector<std::string>& versions)
{
  // The "versions" vector is empty only when the keyword was not present.
  // It is an error to provide the keyword with no versions after it, and that
  // is enforced by the argument parser before we get here.
  if (versions.empty()) {
    return {};
  }

  // The first supported version listed is what we use
  for (const std::string& ver : versions) {
    const char* vStart = ver.c_str();
    int majorVersion = std::atoi(vStart);
    int minorVersion = 0;
    std::string::size_type pos = ver.find('.');
    if (pos != std::string::npos) {
      vStart += pos + 1;
      minorVersion = std::atoi(vStart);
    }
    if (majorVersion < 1 || minorVersion < 0) {
      return cmStrCat("Given a malformed version \"", ver, "\" for ", keyword,
                      ".");
    }
    if (fileApi.AddProjectQuery(objectKind,
                                static_cast<unsigned>(majorVersion),
                                static_cast<unsigned>(minorVersion))) {
      return {};
    }
  }
  return cmStrCat("None of the specified ", keyword,
                  " versions is supported by this version of CMake.");
}